

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O0

URL * __thiscall URL::GetHostName_abi_cxx11_(URL *this)

{
  long in_RSI;
  URL *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x20));
  return this;
}

Assistant:

std::string URL::GetHostName() {
  return _host;
}